

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_conncache_close_all_connections(conncache *connc)

{
  undefined1 local_158 [8];
  sigpipe_ignore pipe_st_1;
  sigpipe_ignore pipe_st;
  connectdata *conn;
  conncache *connc_local;
  
  pipe_st._152_8_ = conncache_find_first_connection(connc);
  while (pipe_st._152_8_ != 0) {
    *(Curl_easy **)pipe_st._152_8_ = connc->closure_handle;
    sigpipe_ignore(*(Curl_easy **)pipe_st._152_8_,(sigpipe_ignore *)&pipe_st_1.no_signal);
    Curl_conncontrol((connectdata *)pipe_st._152_8_,1);
    Curl_disconnect(connc->closure_handle,(connectdata *)pipe_st._152_8_,false);
    sigpipe_restore((sigpipe_ignore *)&pipe_st_1.no_signal);
    pipe_st._152_8_ = conncache_find_first_connection(connc);
  }
  if (connc->closure_handle != (Curl_easy *)0x0) {
    sigpipe_ignore(connc->closure_handle,(sigpipe_ignore *)local_158);
    Curl_hostcache_clean(connc->closure_handle,(connc->closure_handle->dns).hostcache);
    Curl_close(connc->closure_handle);
    sigpipe_restore((sigpipe_ignore *)local_158);
  }
  return;
}

Assistant:

void Curl_conncache_close_all_connections(struct conncache *connc)
{
  struct connectdata *conn;

  conn = conncache_find_first_connection(connc);
  while(conn) {
    SIGPIPE_VARIABLE(pipe_st);
    conn->data = connc->closure_handle;

    sigpipe_ignore(conn->data, &pipe_st);
    /* This will remove the connection from the cache */
    connclose(conn, "kill all");
    (void)Curl_disconnect(connc->closure_handle, conn, FALSE);
    sigpipe_restore(&pipe_st);

    conn = conncache_find_first_connection(connc);
  }

  if(connc->closure_handle) {
    SIGPIPE_VARIABLE(pipe_st);
    sigpipe_ignore(connc->closure_handle, &pipe_st);

    Curl_hostcache_clean(connc->closure_handle,
                         connc->closure_handle->dns.hostcache);
    Curl_close(connc->closure_handle);
    sigpipe_restore(&pipe_st);
  }
}